

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imageio_utility.h
# Opt level: O0

float imageio::convertSIntToFloat(uint32_t rawBits,uint32_t numBits)

{
  int iVar1;
  uint in_ESI;
  uint in_EDI;
  int signedValue;
  uint valueBits;
  bool signBit;
  
  if (in_ESI == 0 || 0x20 < in_ESI) {
    __assert_fail("numBits > 0 && numBits <= 32",
                  "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/tools/imageio/./imageio_utility.h"
                  ,0xbd,"float imageio::convertSIntToFloat(uint32_t, uint32_t)");
  }
  iVar1 = 1;
  if ((in_EDI & 1 << ((char)in_ESI - 1U & 0x1f)) != 0) {
    iVar1 = -1;
  }
  return (float)(int)((in_EDI & (1 << ((char)in_ESI - 1U & 0x1f) ^ 0xffffffffU)) * iVar1);
}

Assistant:

[[nodiscard]] inline float convertSIntToFloat(uint32_t rawBits, uint32_t numBits) {
    assert(numBits > 0 && numBits <= 32);
    const auto signBit = (rawBits & 1u << (numBits - 1)) != 0;
    const auto valueBits = rawBits & ~(1u << (numBits - 1));
    const auto signedValue = static_cast<int32_t>(valueBits) * (signBit ? -1 : 1);
    return static_cast<float>(signedValue);
}